

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VLinearCombination(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  N_Vector X_00;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  timespec spec;
  N_Vector V [3];
  int local_a0;
  timespec local_88;
  undefined8 local_78;
  double local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  N_Vector local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  X_00 = (N_Vector)N_VClone();
  uVar2 = N_VClone(X);
  local_78 = N_VClone(X);
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  local_48 = X_00;
  local_40 = uVar2;
  local_38 = local_78;
  N_VConst(0,X_00);
  local_68 = 0x3fe0000000000000;
  local_a0 = 1;
  clock_gettime(1,&local_88);
  lVar3 = local_88.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombination(1,&local_68,&local_48,X_00);
  sync_device(X);
  clock_gettime(1,&local_88);
  local_70 = (double)local_88.tv_nsec / 1000000000.0 + (double)(local_88.tv_sec - base_time_tv_sec);
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,X_00,param_2);
    if (iVar1 != 0) goto LAB_00107a1f;
    local_a0 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombination Case 1a ");
    }
  }
  else {
LAB_00107a1f:
    printf(">>> FAILED test -- N_VLinearCombination Case 1a, Proc %d \n",(ulong)(uint)myid);
  }
  dVar5 = max_time(X,local_70 - (dVar5 / 1000000000.0 + (double)lVar3));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar5,0),"N_VLinearCombination");
  }
  N_VConst(0,X_00);
  local_68 = 0x3fe0000000000000;
  N_VConst(0,X);
  clock_gettime(1,&local_88);
  lVar3 = local_88.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombination(1,&local_68,&local_48,X);
  sync_device(X);
  clock_gettime(1,&local_88);
  local_70 = (double)local_88.tv_nsec / 1000000000.0 + (double)(local_88.tv_sec - base_time_tv_sec);
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,X,param_2);
    if (iVar1 != 0) goto LAB_00107b5c;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombination Case 1b ");
    }
  }
  else {
LAB_00107b5c:
    printf(">>> FAILED test -- N_VLinearCombination Case 1b, Proc %d \n",(ulong)(uint)myid);
    local_a0 = local_a0 + 1;
  }
  dVar5 = max_time(X,local_70 - (dVar5 / 1000000000.0 + (double)lVar3));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar5,0),"N_VLinearCombination");
  }
  N_VConst(0,X_00);
  N_VConst(0,uVar2);
  local_68 = 0x3fe0000000000000;
  uStack_60 = 0x4000000000000000;
  clock_gettime(1,&local_88);
  lVar3 = local_88.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombination(2,&local_68,&local_48,X_00);
  sync_device(X);
  clock_gettime(1,&local_88);
  lVar4 = local_88.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,X_00,param_2);
    if (iVar1 != 0) goto LAB_00107c96;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombination Case 2a ");
    }
  }
  else {
LAB_00107c96:
    printf(">>> FAILED test -- N_VLinearCombination Case 2a, Proc %d \n",(ulong)(uint)myid);
    local_a0 = local_a0 + 1;
  }
  dVar5 = max_time(X,(dVar5 / 1000000000.0 + (double)lVar4) - (dVar6 / 1000000000.0 + (double)lVar3)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar5,0),"N_VLinearCombination");
  }
  N_VConst(0,X_00);
  N_VConst(0,uVar2);
  local_68 = 0x4000000000000000;
  uStack_60 = 0x3fe0000000000000;
  N_VConst(0,X);
  clock_gettime(1,&local_88);
  lVar3 = local_88.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombination(2,&local_68,&local_48,X);
  sync_device(X);
  clock_gettime(1,&local_88);
  lVar4 = local_88.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,X,param_2);
    if (iVar1 != 0) goto LAB_00107ddb;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombination Case 2b ");
    }
  }
  else {
LAB_00107ddb:
    printf(">>> FAILED test -- N_VLinearCombination Case 2b, Proc %d \n",(ulong)(uint)myid);
    local_a0 = local_a0 + 1;
  }
  dVar5 = max_time(X,(dVar5 / 1000000000.0 + (double)lVar4) - (dVar6 / 1000000000.0 + (double)lVar3)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar5,0),"N_VLinearCombination");
  }
  N_VConst(0,X_00);
  N_VConst(0,uVar2);
  N_VConst(0,local_78);
  local_68 = 0x3ff0000000000000;
  uStack_60 = 0x3fe0000000000000;
  local_58 = 0xc000000000000000;
  clock_gettime(1,&local_88);
  lVar3 = local_88.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombination(3,&local_68,&local_48,X_00);
  sync_device(X);
  clock_gettime(1,&local_88);
  lVar4 = local_88.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(3.0,X_00,param_2);
    if (iVar1 != 0) goto LAB_00107f35;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombination Case 3a ");
    }
  }
  else {
LAB_00107f35:
    printf(">>> FAILED test -- N_VLinearCombination Case 3a, Proc %d \n",(ulong)(uint)myid);
    local_a0 = local_a0 + 1;
  }
  dVar5 = max_time(X,(dVar5 / 1000000000.0 + (double)lVar4) - (dVar6 / 1000000000.0 + (double)lVar3)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar5,0),"N_VLinearCombination");
  }
  N_VConst(0,X_00);
  N_VConst(0,uVar2);
  N_VConst(0,local_78);
  local_68 = 0x4000000000000000;
  uStack_60 = 0x3fe0000000000000;
  local_58 = 0xbff0000000000000;
  clock_gettime(1,&local_88);
  lVar3 = local_88.tv_sec - base_time_tv_sec;
  dVar6 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombination(3,&local_68,&local_48,X_00);
  sync_device(X);
  clock_gettime(1,&local_88);
  lVar4 = local_88.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(2.0,X_00,param_2);
    if (iVar1 != 0) goto LAB_0010808f;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombination Case 3b ");
    }
  }
  else {
LAB_0010808f:
    printf(">>> FAILED test -- N_VLinearCombination Case 3b, Proc %d \n",(ulong)(uint)myid);
    local_a0 = local_a0 + 1;
  }
  dVar5 = max_time(X,(dVar5 / 1000000000.0 + (double)lVar4) - (dVar6 / 1000000000.0 + (double)lVar3)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar5,0),"N_VLinearCombination");
  }
  N_VConst(0,X_00);
  N_VConst(0,uVar2);
  N_VConst(0,local_78);
  local_68 = 0x4000000000000000;
  uStack_60 = 0x3fe0000000000000;
  local_58 = 0xbff0000000000000;
  N_VConst(0,X);
  clock_gettime(1,&local_88);
  lVar3 = local_88.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombination(3,&local_68,&local_48,X);
  sync_device(X);
  clock_gettime(1,&local_88);
  lVar4 = local_88.tv_sec - base_time_tv_sec;
  if (iVar1 == 0) {
    iVar1 = check_ans(2.0,X,param_2);
    if (iVar1 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VLinearCombination Case 3c ");
      }
      goto LAB_00108200;
    }
  }
  printf(">>> FAILED test -- N_VLinearCombination Case 3c, Proc %d \n",(ulong)(uint)myid);
  local_a0 = local_a0 + 1;
LAB_00108200:
  dVar5 = max_time(X,((double)local_88.tv_nsec / 1000000000.0 + (double)lVar4) -
                     (dVar5 / 1000000000.0 + (double)lVar3));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar5,0),"N_VLinearCombination");
  }
  N_VDestroy(X_00);
  N_VDestroy(uVar2);
  N_VDestroy(local_78);
  return local_a0;
}

Assistant:

int Test_N_VLinearCombination(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  N_Vector Y1, Y2, Y3;
  N_Vector V[3];
  sunrealtype c[3];

  /* create vectors for testing */
  Y1 = N_VClone(X);
  Y2 = N_VClone(X);
  Y3 = N_VClone(X);

  /* set vectors in vector array */
  V[0] = Y1;
  V[1] = Y2;
  V[2] = Y3;

  /* initialize c values */
  c[0] = ZERO;
  c[1] = ZERO;
  c[2] = ZERO;

  /*
   * Case 1a: V[0] = a V[0], N_VScale
   */

  /* fill vector data */
  N_VConst(TWO, Y1);

  /* set scaling factors */
  c[0] = HALF;

  start_time = get_time();
  ierr       = N_VLinearCombination(1, c, V, Y1);
  sync_device(X);
  stop_time = get_time();

  /* Y1 should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Y1, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 1a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 1b: X = a V[0], N_VScale
   */

  /* fill vector data and scaling factors */
  N_VConst(TWO, Y1);

  c[0] = HALF;

  N_VConst(ZERO, X);

  start_time = get_time();
  ierr       = N_VLinearCombination(1, c, V, X);
  sync_device(X);
  stop_time = get_time();

  /* X should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, X, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 1b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 2a: V[0] = a V[0] + b V[1], N_VLinearSum
   */

  /* fill vector data */
  N_VConst(NEG_TWO, Y1);
  N_VConst(ONE, Y2);

  /* set scaling factors */
  c[0] = HALF;
  c[1] = TWO;

  start_time = get_time();
  ierr       = N_VLinearCombination(2, c, V, Y1);
  sync_device(X);
  stop_time = get_time();

  /* Y1 should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Y1, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 2a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 2b: X = a V[0] + b V[1], N_VLinearSum
   */

  /* fill vector data and scaling factors */
  N_VConst(ONE, Y1);
  N_VConst(NEG_TWO, Y2);

  c[0] = TWO;
  c[1] = HALF;

  N_VConst(ZERO, X);

  start_time = get_time();
  ierr       = N_VLinearCombination(2, c, V, X);
  sync_device(X);
  stop_time = get_time();

  /* X should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, X, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 2b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 3a: V[0] = V[0] + b V[1] + c V[2]
   */

  /* fill vector data */
  N_VConst(TWO, Y1);
  N_VConst(NEG_TWO, Y2);
  N_VConst(NEG_ONE, Y3);

  /* set scaling factors */
  c[0] = ONE;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr       = N_VLinearCombination(3, c, V, Y1);
  sync_device(X);
  stop_time = get_time();

  /* Y1 should be vector of +3 */
  if (ierr == 0) { failure = check_ans(TWO + ONE, Y1, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 3a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 3a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 3b: V[0] = a V[0] + b V[1] + c V[2]
   */

  /* fill vector data */
  N_VConst(ONE, Y1);
  N_VConst(NEG_TWO, Y2);
  N_VConst(NEG_ONE, Y3);

  /* set scaling factors */
  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombination(3, c, V, Y1);
  sync_device(X);
  stop_time = get_time();

  /* Y1 should be vector of +2 */
  if (ierr == 0) { failure = check_ans(TWO, Y1, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 3b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 3b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /*
   * Case 3c: X = a V[0] + b V[1] + c V[2]
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, Y1);
  N_VConst(NEG_TWO, Y2);
  N_VConst(NEG_ONE, Y3);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  N_VConst(ZERO, X);

  start_time = get_time();
  ierr       = N_VLinearCombination(3, c, V, X);
  sync_device(X);
  stop_time = get_time();

  /* X should be vector of +2 */
  if (ierr == 0) { failure = check_ans(TWO, X, local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombination Case 3c, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombination Case 3c \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VLinearCombination", maxt);

  /* Free vectors */
  N_VDestroy(Y1);
  N_VDestroy(Y2);
  N_VDestroy(Y3);

  return (fails);
}